

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O2

void __thiscall
TypedImageChannel<Imath_3_2::half>::resize
          (TypedImageChannel<Imath_3_2::half> *this,int width,int height)

{
  Imf_3_4::Array2D<Imath_3_2::half>::resizeEraseUnsafe(&this->_pixels,(long)height,(long)width);
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}